

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O2

void duckdb::
     HistogramFunction<duckdb::DefaultMapType<std::map<unsigned_short,unsigned_long,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_long>>>>>
     ::
     Combine<duckdb::HistogramAggState<unsigned_short,std::map<unsigned_short,unsigned_long,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_long>>>>,duckdb::HistogramFunction<duckdb::DefaultMapType<std::map<unsigned_short,unsigned_long,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_long>>>>>>
               (HistogramAggState<unsigned_short,_std::map<unsigned_short,_unsigned_long,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_long>_>_>_>
                *source,HistogramAggState<unsigned_short,_std::map<unsigned_short,_unsigned_long,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_long>_>_>_>
                        *target,AggregateInputData *input_data)

{
  _Base_ptr p_Var1;
  map<unsigned_short,_unsigned_long,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_long>_>_>
  *pmVar2;
  mapped_type_conflict *pmVar3;
  _Base_ptr p_Var4;
  
  pmVar2 = source->hist;
  if (pmVar2 != (map<unsigned_short,_unsigned_long,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_long>_>_>
                 *)0x0) {
    if (target->hist ==
        (map<unsigned_short,_unsigned_long,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_long>_>_>
         *)0x0) {
      pmVar2 = DefaultMapType<std::map<unsigned_short,_unsigned_long,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_long>_>_>_>
               ::CreateEmpty(input_data->allocator);
      target->hist = pmVar2;
      pmVar2 = source->hist;
    }
    for (p_Var4 = (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(pmVar2->_M_t)._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)::std::_Rb_tree_increment(p_Var4)) {
      p_Var1 = p_Var4[1]._M_parent;
      pmVar3 = ::std::
               map<unsigned_short,_unsigned_long,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_long>_>_>
               ::operator[](target->hist,(key_type_conflict3 *)(p_Var4 + 1));
      *pmVar3 = (long)&p_Var1->_M_color + *pmVar3;
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &input_data) {
		if (!source.hist) {
			return;
		}
		if (!target.hist) {
			target.hist = MAP_TYPE::CreateEmpty(input_data.allocator);
		}
		for (auto &entry : *source.hist) {
			(*target.hist)[entry.first] += entry.second;
		}
	}